

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_write.cpp
# Opt level: O2

bool __thiscall
ritobin::io::impl_binary_write::BinBinaryWriter::write_value_visit
          (BinBinaryWriter *this,Option *value)

{
  Value *pVVar1;
  Value *pVVar2;
  bool bVar3;
  byte bVar4;
  long lVar5;
  ssize_t sVar6;
  ulong extraout_RAX;
  ulong uVar7;
  size_t in_RCX;
  Value *value_00;
  char *msg;
  Value *item;
  
  bVar3 = ValueHelperImpl<std::variant<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>_>
          ::is_container(value->valueType);
  if (bVar3) {
    msg = "!ValueHelper::is_container(value.valueType)\n";
  }
  else {
    lVar5 = (long)(value->items).
                  super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(value->items).
                  super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if ((ulong)(lVar5 / 0x48) < 2) {
      sVar6 = BinaryWriter::write(&this->writer,(uint)value->valueType,(void *)(lVar5 % 0x48),in_RCX
                                 );
      if ((char)sVar6 != '\0') {
        BinaryWriter::write<unsigned_char>
                  (&this->writer,
                   (uchar)(((long)(value->items).
                                  super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(value->items).
                                 super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0x48));
        pVVar1 = &((value->items).
                   super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>._M_impl.
                   super__Vector_impl_data._M_finish)->value;
        uVar7 = extraout_RAX;
        pVVar2 = &((value->items).
                   super__Vector_base<ritobin::Element,_std::allocator<ritobin::Element>_>._M_impl.
                   super__Vector_impl_data._M_start)->value;
        do {
          value_00 = pVVar2;
          bVar4 = (byte)uVar7;
          if (value_00 == pVVar1) goto LAB_001125d7;
          bVar3 = write_value(this,value_00,value->valueType);
          uVar7 = (ulong)bVar3;
          pVVar2 = value_00 + 1;
        } while (bVar3);
        bVar4 = fail_msg(this,"write_value(item, value.valueType)\n");
LAB_001125d7:
        return (bool)(value_00 == pVVar1 | bVar4 & 1);
      }
      msg = "writer.write(value.valueType)\n";
    }
    else {
      msg = "value.items.size() <= 1\n";
    }
  }
  bVar3 = fail_msg(this,msg);
  return bVar3;
}

Assistant:

bool write_value_visit(Option const& value) noexcept {
            bin_assert(!ValueHelper::is_container(value.valueType));
            bin_assert(value.items.size() <= 1);
            bin_assert(writer.write(value.valueType));
            writer.write(static_cast<uint8_t>(value.items.size()));
            for (auto const& [item] : value.items) {
                bin_assert(write_value(item, value.valueType));
            }
            return true;
        }